

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_binary_write.cpp
# Opt level: O0

void __thiscall
ritobin::io::impl_binary_write::BinaryWriter::write<unsigned_long>
          (BinaryWriter *this,unsigned_long value)

{
  vector<char,std::allocator<char>> *this_00;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_30;
  const_iterator local_28;
  unsigned_long local_20;
  char buffer [8];
  unsigned_long value_local;
  BinaryWriter *this_local;
  
  this_00 = (vector<char,std::allocator<char>> *)this->buffer_;
  local_20 = value;
  buffer = (char  [8])value;
  local_30._M_current =
       (char *)std::vector<char,_std::allocator<char>_>::end
                         ((vector<char,_std::allocator<char>_> *)this_00);
  __gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>::
  __normal_iterator<char*>
            ((__normal_iterator<char_const*,std::vector<char,std::allocator<char>>> *)&local_28,
             &local_30);
  std::vector<char,std::allocator<char>>::insert<char*,void>
            (this_00,local_28,(char *)&local_20,buffer);
  return;
}

Assistant:

void write(T value) noexcept {
            static_assert(std::is_arithmetic_v<T>);
            char buffer[sizeof(value)];
            memcpy(buffer, &value, sizeof(value));
            buffer_.insert(buffer_.end(), buffer, buffer + sizeof(buffer));
        }